

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summaryindex.cpp
# Opt level: O2

void summaryindex::doit(string *subfolder)

{
  _Rb_tree_color _Var1;
  bool bVar2;
  DIR *__dirp;
  dirent *pdVar3;
  FILE *pFVar4;
  _Base_ptr p_Var5;
  _Rb_tree_color _Var6;
  int iVar7;
  _Self __tmp;
  _Base_ptr p_Var8;
  pointer pbVar9;
  string filename;
  string path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  map<summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  summary_id_file_id_to_offset;
  vector<int,_std::allocator<int>_> event_ids;
  string s2;
  
  std::operator+(&path,"work/",subfolder);
  std::__cxx11::string::substr((ulong)&summary_id_file_id_to_offset,(ulong)&path);
  bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &summary_id_file_id_to_offset,"/");
  std::__cxx11::string::~string((string *)&summary_id_file_id_to_offset);
  if (bVar2) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &summary_id_file_id_to_offset,&path,"/");
    std::__cxx11::string::operator=((string *)&path,(string *)&summary_id_file_id_to_offset);
    std::__cxx11::string::~string((string *)&summary_id_file_id_to_offset);
  }
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  summary_id_file_id_to_offset._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &summary_id_file_id_to_offset._M_t._M_impl.super__Rb_tree_header._M_header;
  summary_id_file_id_to_offset._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  summary_id_file_id_to_offset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  summary_id_file_id_to_offset._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  event_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  event_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  event_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  summary_id_file_id_to_offset._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       summary_id_file_id_to_offset._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  __dirp = opendir(path._M_dataplus._M_p);
  if (__dirp == (DIR *)0x0) {
    fprintf(_stderr,"FATAL: Unable to open directory %s\n",path._M_dataplus._M_p);
    iVar7 = -1;
  }
  else {
    iVar7 = 0;
    while (pdVar3 = readdir(__dirp), pdVar3 != (dirent *)0x0) {
      std::__cxx11::string::string((string *)&filename,pdVar3->d_name,(allocator *)&s2);
      if (4 < filename._M_string_length) {
        std::__cxx11::string::substr((ulong)&s2,(ulong)&filename);
        bVar2 = std::operator==(&s2,".bin");
        std::__cxx11::string::~string((string *)&s2);
        if (bVar2) {
          std::operator+(&s2,&path,pdVar3->d_name);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&files,&filename);
          indexevents(&s2,&event_ids,&summary_id_file_id_to_offset,iVar7);
          iVar7 = iVar7 + 1;
          std::__cxx11::string::~string((string *)&s2);
        }
      }
      std::__cxx11::string::~string((string *)&filename);
    }
    std::operator+(&filename,&path,"filelist.idx");
    pFVar4 = fopen(filename._M_dataplus._M_p,"wb");
    pbVar9 = files.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pFVar4 != (FILE *)0x0) {
      for (; pbVar9 != files.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish; pbVar9 = pbVar9 + 1) {
        fprintf(pFVar4,"%s\n",(pbVar9->_M_dataplus)._M_p);
      }
      fclose(pFVar4);
      std::operator+(&s2,&path,"summaries.idx");
      std::__cxx11::string::operator=((string *)&filename,(string *)&s2);
      std::__cxx11::string::~string((string *)&s2);
      pFVar4 = fopen(filename._M_dataplus._M_p,"wb");
      if (pFVar4 != (FILE *)0x0) {
        _Var6 = _S_red;
        for (p_Var5 = summary_id_file_id_to_offset._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_left;
            (_Rb_tree_header *)p_Var5 !=
            &summary_id_file_id_to_offset._M_t._M_impl.super__Rb_tree_header;
            p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
          _Var1 = p_Var5[1]._M_color;
          for (p_Var8 = p_Var5[1]._M_parent; p_Var8 != p_Var5[1]._M_left;
              p_Var8 = (_Base_ptr)&p_Var8->_M_parent) {
            fprintf(pFVar4,"%d, %d, %lld\n",(ulong)p_Var5[1]._M_color,
                    (ulong)*(uint *)&p_Var5[1].field_0x4,*(undefined8 *)p_Var8);
          }
          if ((int)_Var6 < (int)_Var1) {
            _Var6 = _Var1;
          }
        }
        fclose(pFVar4);
        std::operator+(&s2,&path,"max_summary_id.idx");
        std::__cxx11::string::operator=((string *)&filename,(string *)&s2);
        std::__cxx11::string::~string((string *)&s2);
        pFVar4 = fopen(filename._M_dataplus._M_p,"wb");
        if (pFVar4 != (FILE *)0x0) {
          fprintf(pFVar4,"%d",(ulong)_Var6);
          fclose(pFVar4);
          std::__cxx11::string::~string((string *)&filename);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&event_ids.super__Vector_base<int,_std::allocator<int>_>);
          std::
          _Rb_tree<summary_keyz,_std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::_Select1st<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>,_std::less<summary_keyz>,_std::allocator<std::pair<const_summary_keyz,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
          ::~_Rb_tree(&summary_id_file_id_to_offset._M_t);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&files);
          std::__cxx11::string::~string((string *)&path);
          return;
        }
      }
    }
    fprintf(_stderr,"FATAL: cannot open %s\n",filename._M_dataplus._M_p);
    iVar7 = 1;
  }
  exit(iVar7);
}

Assistant:

void doit(const std::string& subfolder)
{	
	std::string path = "work/" + subfolder;
	if (path.substr(path.length() - 1, 1) != "/") {
		path = path + "/";
	}

	std::vector<std::string> files;
	//std::map<int, std::vector<int>> summary_id_to_events;
	std::map<summary_keyz, std::vector<long long>> summary_id_file_id_to_offset;
	std::vector<int> event_ids;
	DIR* dir;
	struct dirent* ent;
	int file_index = 0;
	if ((dir = opendir(path.c_str())) != NULL) {
		while ((ent = readdir(dir)) != NULL) {
			std::string s = ent->d_name;
			if (s.length() > 4 && s.substr(s.length() - 4, 4) == ".bin") {
				std::string s2 = path + ent->d_name;
				files.push_back(s);
				indexevents(s2, event_ids, summary_id_file_id_to_offset, file_index);
				file_index++;
			}
		}
	}
	else {
		fprintf(stderr, "FATAL: Unable to open directory %s\n", path.c_str());
		exit(-1);
	}

	std::string filename =  path + "filelist.idx";
	FILE* fout = fopen(filename.c_str(), "wb");
	if (fout == NULL) {
		fprintf(stderr, "FATAL: cannot open %s\n",  filename.c_str());
		exit(EXIT_FAILURE);
	}
	auto iter = files.begin();
	while (iter != files.end()) {
		fprintf(fout, "%s\n", iter->c_str());
		iter++;
	}

	fclose(fout);


	int max_summary_id = 0;
	filename = path + "summaries.idx";
	fout = fopen(filename.c_str(), "wb");
	if (fout == NULL) {
		fprintf(stderr, "FATAL: cannot open %s\n", filename.c_str());
		exit(EXIT_FAILURE);
	}

	auto s_iter = summary_id_file_id_to_offset.begin();
	while (s_iter != summary_id_file_id_to_offset.end()) {
		if (s_iter->first.summary_id > max_summary_id) max_summary_id = s_iter->first.summary_id;
		auto v_iter = s_iter->second.begin();
		while (v_iter != s_iter->second.end()) {
			fprintf(fout, "%d, %d, %lld\n", s_iter->first.summary_id, s_iter->first.fileindex, *v_iter);
			v_iter++;
		}
		s_iter++;
	}
	fclose(fout);

	filename = path + "max_summary_id.idx";
	fout = fopen(filename.c_str(), "wb");
	if (fout == NULL) {
		fprintf(stderr, "FATAL: cannot open %s\n",  filename.c_str());
		exit(EXIT_FAILURE);
	}
	fprintf(fout, "%d", max_summary_id);
	fclose(fout);
	
}